

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf.h
# Opt level: O2

int hydro_kdf_derive_from_key
              (uint8_t *subkey,size_t subkey_len,uint64_t subkey_id,char *ctx,uint8_t *key)

{
  int iVar1;
  ulong uVar2;
  undefined1 local_b8 [4];
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined6 uStack_b0;
  undefined2 uStack_aa;
  undefined1 uStack_a8;
  undefined7 uStack_a7;
  undefined1 uStack_a0;
  undefined7 uStack_9f;
  undefined1 uStack_98;
  undefined7 uStack_97;
  undefined1 uStack_90;
  undefined7 uStack_8f;
  undefined1 uStack_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  hydro_hash_state st;
  
  uStack_b2 = 0;
  uStack_b0 = 0;
  uStack_aa = 0;
  uStack_a8 = 0;
  uStack_a7 = 0;
  uStack_a0 = 0;
  uStack_9f = 0;
  uStack_98 = 0;
  uStack_97 = 0;
  uStack_90 = 0;
  uStack_8f = 0;
  uStack_88 = 0;
  uStack_87 = 0;
  uStack_80 = 0;
  uStack_78 = 0;
  uStack_70 = 0;
  local_b8 = (undefined1  [4])0x616d7404;
  uStack_b4 = 0x863;
  mem_zero(&uStack_aa,0x42);
  uStack_b2 = (undefined2)*(undefined8 *)ctx;
  uStack_b0 = (undefined6)((ulong)*(undefined8 *)ctx >> 0x10);
  if (key == (uint8_t *)0x0) {
    uVar2 = 0x20;
    uStack_a8 = 0;
  }
  else {
    uStack_a7 = (undefined7)*(undefined8 *)key;
    uStack_a0 = (undefined1)((ulong)*(undefined8 *)key >> 0x38);
    uStack_9f = (undefined7)*(undefined8 *)(key + 8);
    uStack_98 = (undefined1)((ulong)*(undefined8 *)(key + 8) >> 0x38);
    uStack_97 = (undefined7)*(undefined8 *)(key + 0x10);
    uStack_90 = (undefined1)((ulong)*(undefined8 *)(key + 0x10) >> 0x38);
    uStack_8f = (undefined7)*(undefined8 *)(key + 0x18);
    uStack_88 = (undefined1)((ulong)*(undefined8 *)(key + 0x18) >> 0x38);
    uVar2 = 0x40;
    uStack_a8 = 0x20;
  }
  local_b8[uVar2] = 8;
  *(uint64_t *)(local_b8 + uVar2 + 1) = subkey_id;
  mem_zero(&st,0x34);
  hydro_hash_update(&st,local_b8,uVar2 | 0x10);
  iVar1 = hydro_hash_final(&st,subkey,subkey_len);
  return iVar1;
}

Assistant:

int
hydro_kdf_derive_from_key(uint8_t *subkey, size_t subkey_len, uint64_t subkey_id,
                          const char    ctx[hydro_kdf_CONTEXTBYTES],
                          const uint8_t key[hydro_kdf_KEYBYTES])
{
    hydro_hash_state st;

    COMPILER_ASSERT(hydro_kdf_CONTEXTBYTES >= hydro_hash_CONTEXTBYTES);
    COMPILER_ASSERT(hydro_kdf_KEYBYTES >= hydro_hash_KEYBYTES);
    if (hydro_hash_init_with_tweak(&st, ctx, subkey_id, key) != 0) {
        return -1;
    }
    return hydro_hash_final(&st, subkey, subkey_len);
}